

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall
ON_BinaryArchive::Internal_Write3dmTextStyle(ON_BinaryArchive *this,ON_TextStyle *text_style)

{
  bool bVar1;
  ON_3DM_BIG_CHUNK *pOVar2;
  ON_3DM_BIG_CHUNK *c;
  bool rc;
  ON_TextStyle *text_style_local;
  ON_BinaryArchive *this_local;
  
  bVar1 = ArchiveContains3dmTable(this,text_style_table);
  if (bVar1) {
    bVar1 = Internal_Begin3dmTableRecord(this,text_style_table);
    if (bVar1) {
      Internal_Increment3dmTableItemCount(this);
      pOVar2 = ON_SimpleArray<ON_3DM_BIG_CHUNK>::Last(&this->m_chunk);
      if ((pOVar2 == (ON_3DM_BIG_CHUNK *)0x0) || (pOVar2->m_typecode != 0x10000019)) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                   ,0x2963,"",
                   "ON_BinaryArchive::Write3dmTextStyle() must be called in BeginWrite3dmTextStyleTable() block"
                  );
        c._7_1_ = false;
      }
      else {
        c._7_1_ = BeginWrite3dmChunk(this,0x20008074,0);
        if (c._7_1_) {
          Internal_Write3dmUpdateManifest(this,&text_style->super_ON_ModelComponent);
          c._7_1_ = WriteObject(this,(ON_Object *)text_style);
          bVar1 = EndWrite3dmChunk(this);
          if (!bVar1) {
            c._7_1_ = false;
          }
        }
      }
      this_local._7_1_ = c._7_1_;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_BinaryArchive::Internal_Write3dmTextStyle(
  const class ON_TextStyle& text_style
  )
{
  if (false == ArchiveContains3dmTable(ON_3dmArchiveTableType::text_style_table))
    return true;

  if ( false == Internal_Begin3dmTableRecord(ON_3dmArchiveTableType::text_style_table) )
   return false;

  Internal_Increment3dmTableItemCount();

  bool rc = false;

  const ON_3DM_BIG_CHUNK* c = m_chunk.Last();
  if ( c && c->m_typecode == TCODE_FONT_TABLE ) 
  {
    rc = BeginWrite3dmChunk( TCODE_FONT_RECORD, 0 );
    if ( rc ) 
    {
      Internal_Write3dmUpdateManifest(text_style);
      rc = WriteObject( text_style );
      if ( !EndWrite3dmChunk() )
        rc = false;
    }
  }
  else 
  {
    ON_ERROR("ON_BinaryArchive::Write3dmTextStyle() must be called in BeginWrite3dmTextStyleTable() block");
    rc = false;
  }

  return rc;
}